

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

CTcSymbol * __thiscall
CTcPrsSymtab::find_or_def
          (CTcPrsSymtab *this,textchar_t *sym,size_t len,int copy_str,tcprs_undef_action action)

{
  byte *pbVar1;
  CTcPrsSymtab *pCVar2;
  short sVar3;
  byte bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CVmHashEntry *this_00;
  CTcSymbol *pCVar6;
  
  iVar5 = (*this->_vptr_CTcPrsSymtab[2])();
  pCVar6 = (CTcSymbol *)CONCAT44(extraout_var,iVar5);
  if (pCVar6 == (CTcSymbol *)0x0) {
    do {
      pCVar2 = this->parent_;
      if (pCVar2 == (CTcPrsSymtab *)0x0) {
        if (action - TCPRS_UNDEF_ADD_PROP < 3) {
          this_00 = (CVmHashEntry *)CTcPrsMem::alloc(G_prsmem,0x30);
          sVar3 = (short)*(undefined4 *)&G_cg->next_prop_;
          G_cg->next_prop_ = sVar3 + 1;
          CVmHashEntry::CVmHashEntry(this_00,sym,len,copy_str);
          *(undefined4 *)&this_00->field_0x24 = 3;
          *(short *)&this_00[1]._vptr_CVmHashEntry = sVar3;
          bVar4 = *(byte *)((long)&this_00[1]._vptr_CVmHashEntry + 2) & 0xf8;
          *(byte *)((long)&this_00[1]._vptr_CVmHashEntry + 2) = bVar4;
          this_00->_vptr_CVmHashEntry = (_func_int **)&PTR__CVmHashEntry_0035b960;
          if (action == TCPRS_UNDEF_ADD_PROP) {
            CTcTokenizer::log_warning(0x2b19,len & 0xffffffff,sym);
          }
          else if (action == TCPRS_UNDEF_ADD_PROP_WEAK) {
            *(byte *)((long)&this_00[1]._vptr_CVmHashEntry + 2) = bVar4 | 4;
          }
LAB_00231003:
          add_to_global_symtab(this,(CTcSymbol *)this_00);
          return (CTcSymbol *)this_00;
        }
        if (action == TCPRS_UNDEF_ADD_UNDEF) {
          CTcTokenizer::log_error(0x2b18,len & 0xffffffff,sym);
          this_00 = (CVmHashEntry *)CTcPrsMem::alloc(G_prsmem,0x28);
          CVmHashEntry::CVmHashEntry(this_00,sym,len,copy_str);
          *(undefined4 *)&this_00->field_0x24 = 0;
          this_00->_vptr_CVmHashEntry = (_func_int **)&PTR__CVmHashEntry_00354c90;
          goto LAB_00231003;
        }
      }
      iVar5 = (*pCVar2->_vptr_CTcPrsSymtab[2])(pCVar2,sym,len);
      pCVar6 = (CTcSymbol *)CONCAT44(extraout_var_00,iVar5);
      this = pCVar2;
    } while (pCVar6 == (CTcSymbol *)0x0);
  }
  (*(pCVar6->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry[0xf])
            (pCVar6);
  if ((action - TCPRS_UNDEF_ADD_PROP < 2) &&
     (*(int *)&(pCVar6->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.field_0x24 == 3
     )) {
    pbVar1 = (byte *)((long)&pCVar6[1].super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
                             _vptr_CVmHashEntry + 2);
    *pbVar1 = *pbVar1 & 0xfb;
  }
  return pCVar6;
}

Assistant:

CTcSymbol *CTcPrsSymtab::find_or_def(const textchar_t *sym, size_t len,
                                     int copy_str, tcprs_undef_action action)
{
    /*
     *   Look for the symbol.  Start in the current symbol table, and work
     *   outwards to the outermost enclosing table. 
     */
    for (CTcPrsSymtab *curtab = this ; ; curtab = curtab->get_parent())
    {
        /* look for the symbol in this table */
        CTcSymbol *entry = (CTcSymbol *)curtab->find_direct(sym, len);
        if (entry != 0)
        {
            /* mark the entry as referenced */
            entry->mark_referenced();

            /* 
             *   if this is a non-weak property definition, and this is a
             *   property symbol, remove any existing weak flag from the
             *   property symbol 
             */
            if (entry->get_type() == TC_SYM_PROP
                && (action == TCPRS_UNDEF_ADD_PROP
                    || action == TCPRS_UNDEF_ADD_PROP_NO_WARNING))
                ((CTcSymProp *)entry)->set_weak(FALSE);

            /* found it - return the symbol */
            return entry;
        }

        /* 
         *   If there's no parent symbol table, the symbol is undefined.
         *   Add a new symbol according to the action parameter.  Note
         *   that we always add the new symbol at global scope, hence we
         *   add it to 'curtab', not 'this'.  
         */
        if (curtab->get_parent() == 0)
        {
            /* check which action we're being asked to perform */
            switch(action)
            {
            case TCPRS_UNDEF_ADD_UNDEF:
                /* add an "undefined" entry - log an error */
                G_tok->log_error(TCERR_UNDEF_SYM, (int)len, sym);

                /* create a new symbol of type undefined */
                entry = new CTcSymUndef(sym, len, copy_str);

                /* finish up */
                goto add_entry;

            case TCPRS_UNDEF_ADD_PROP:
            case TCPRS_UNDEF_ADD_PROP_NO_WARNING:
            case TCPRS_UNDEF_ADD_PROP_WEAK:
                {
                    /* create a new symbol of type property */
                    CTcSymProp *prop = new CTcSymProp(
                        sym, len, copy_str, G_cg->new_prop_id());

                    /* mark it as "weak" if desired */
                    if (action == TCPRS_UNDEF_ADD_PROP_WEAK)
                        prop->set_weak(TRUE);

                    /* use it as the new table entry */
                    entry = prop;
                }
                
                /* show a warning if desired */
                if (action == TCPRS_UNDEF_ADD_PROP)
                    G_tok->log_warning(TCERR_ASSUME_SYM_PROP, (int)len, sym);

                /* finish up */
                goto add_entry;

            add_entry:
                /* add the new entry to the global table */
                add_to_global_symtab(curtab, entry);

                /* return the new entry */
                return entry;
            }
        }
    }
}